

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_type sVar2;
  LogStream *str_00;
  char **in_RSI;
  int in_EDI;
  Server myHTTPServer;
  EventLoop mainLoop;
  char *str;
  int opt;
  string logPath;
  int port;
  int threadNum;
  char *in_stack_ffffffffffffeee8;
  undefined4 in_stack_ffffffffffffeef0;
  int in_stack_ffffffffffffeef4;
  allocator<char> *in_stack_ffffffffffffef20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffef28;
  int in_stack_ffffffffffffef30;
  int in_stack_ffffffffffffef34;
  EventLoop *in_stack_ffffffffffffef38;
  Server *in_stack_ffffffffffffef40;
  EventLoop *in_stack_ffffffffffffef50;
  Server *in_stack_ffffffffffffeff0;
  EventLoop *in_stack_fffffffffffff020;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_18;
  int local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 4;
  local_18 = 0x1f98;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30),
             (char *)in_stack_ffffffffffffef28,in_stack_ffffffffffffef20);
  std::allocator<char>::~allocator(&local_39);
  do {
    while( true ) {
      iVar1 = getopt(local_8,local_10,"t:l:p");
      if (iVar1 == -1) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30),
                   in_stack_ffffffffffffef28);
        Logger::setLogFileName((string *)0x11b1dd);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
        Logger::Logger((Logger *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                       in_stack_ffffffffffffeee8,0);
        str_00 = Logger::stream((Logger *)&stack0xffffffffffffefb0);
        LogStream::operator<<
                  ((LogStream *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                   (char *)str_00);
        Logger::~Logger((Logger *)CONCAT44(in_stack_ffffffffffffef34,in_stack_ffffffffffffef30));
        EventLoop::EventLoop(in_stack_fffffffffffff020);
        Server::Server(in_stack_ffffffffffffef40,in_stack_ffffffffffffef38,in_stack_ffffffffffffef34
                       ,in_stack_ffffffffffffef30);
        Server::start(in_stack_ffffffffffffeff0);
        EventLoop::loop(in_stack_ffffffffffffef50);
        local_4 = 0;
        Server::~Server((Server *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
        EventLoop::~EventLoop
                  ((EventLoop *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
        return local_4;
      }
      if (iVar1 == 0x6c) break;
      if (iVar1 == 0x70) {
        local_18 = atoi(_optarg);
        in_stack_ffffffffffffeef4 = iVar1;
      }
      else {
        in_stack_ffffffffffffeef4 = iVar1;
        if (iVar1 == 0x74) {
          local_14 = atoi(_optarg);
          in_stack_ffffffffffffeef4 = iVar1;
        }
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(0x6c,in_stack_ffffffffffffeef0),in_stack_ffffffffffffeee8);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_38);
  } while ((1 < sVar2) && (in_stack_ffffffffffffeef4 = iVar1, *_optarg == '/'));
  printf("logPath should start with \"/\"\n");
  abort();
}

Assistant:

int main(int argc, char* argv[]){
    int threadNum = 4;
    int port = 8088;
    std::string logPath = "./WebServer.log";

    // parse args
    int opt;
    const char* str = "t:l:p";
    while((opt = getopt(argc, argv, str))!=-1){
        switch (opt)
        {
        case 't':{
            threadNum = atoi(optarg);
            break;
        } 
        case 'l':{
            logPath = optarg;
            if(logPath.size() <2 || optarg[0]!= '/'){   // 这要求路径开始必须为：""/"  
                printf("logPath should start with \"/\"\n");
                abort();
            }
            break;
        }
        case 'p':{
            port = atoi(optarg);
            break;
        }
        default:
            break;
        }
    }
    Logger::setLogFileName(logPath);

    // STL库在多线程上使用
#ifndef _PTHREADS
    LOG<<"_PTHREADS is not defined!";
#endif
    EventLoop mainLoop;
    Server myHTTPServer(&mainLoop, threadNum, port);
    myHTTPServer.start();
    mainLoop.loop();
    
    return 0;
}